

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZEqnArray<double>,_10>::~TPZManVector(TPZManVector<TPZEqnArray<double>,_10> *this)

{
  long lVar1;
  
  (this->super_TPZVec<TPZEqnArray<double>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_017c3858;
  if ((this->super_TPZVec<TPZEqnArray<double>_>).fStore == (TPZEqnArray<double> *)&this->field_0x20)
  {
    (this->super_TPZVec<TPZEqnArray<double>_>).fStore = (TPZEqnArray<double> *)0x0;
  }
  (this->super_TPZVec<TPZEqnArray<double>_>).fNAlloc = 0;
  lVar1 = 0x1c730;
  do {
    TPZEqnArray<double>::~TPZEqnArray
              ((TPZEqnArray<double> *)
               ((long)&(this->super_TPZVec<TPZEqnArray<double>_>)._vptr_TPZVec + lVar1));
    lVar1 = lVar1 + -0x3290;
  } while (lVar1 != -0x3270);
  TPZVec<TPZEqnArray<double>_>::~TPZVec(&this->super_TPZVec<TPZEqnArray<double>_>);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}